

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhLoadPage(lhash_kv_engine *pEngine,pgno pnum,lhpage *pMaster,lhpage **ppOut,int iNest)

{
  int iVar1;
  int local_4c;
  lhpage *plStack_48;
  int rc;
  lhpage *pPage;
  unqlite_page *pRaw;
  lhpage **pplStack_30;
  int iNest_local;
  lhpage **ppOut_local;
  lhpage *pMaster_local;
  pgno pnum_local;
  lhash_kv_engine *pEngine_local;
  
  pRaw._4_4_ = iNest;
  pplStack_30 = ppOut;
  ppOut_local = (lhpage **)pMaster;
  pMaster_local = (lhpage *)pnum;
  pnum_local = (pgno)pEngine;
  iVar1 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,pnum,(unqlite_page **)&pPage);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (pPage->pRaw == (unqlite_page *)0x0) {
    plStack_48 = lhNewPage((lhash_kv_engine *)pnum_local,(unqlite_page *)pPage,(lhpage *)ppOut_local
                          );
    if (plStack_48 == (lhpage *)0x0) {
      return -1;
    }
    local_4c = lhParsePageHeader(plStack_48);
    if (local_4c == 0) {
      local_4c = lhLoadCells(plStack_48);
    }
    iVar1 = pRaw._4_4_;
    if (local_4c != 0) {
      (**(code **)(*(long *)pnum_local + 0x50))(plStack_48->pRaw);
      return local_4c;
    }
    if (((plStack_48->sHdr).iSlave != 0) && (pRaw._4_4_ < 0x80)) {
      if (ppOut_local == (lhpage **)0x0) {
        ppOut_local = (lhpage **)plStack_48;
      }
      pRaw._4_4_ = pRaw._4_4_ + 1;
      lhLoadPage((lhash_kv_engine *)pnum_local,(plStack_48->sHdr).iSlave,(lhpage *)ppOut_local,
                 (lhpage **)0x0,iVar1);
    }
  }
  else {
    plStack_48 = (lhpage *)pPage->pRaw;
  }
  if (pplStack_30 != (lhpage **)0x0) {
    *pplStack_30 = plStack_48;
  }
  return 0;
}

Assistant:

static int lhLoadPage(lhash_kv_engine *pEngine,pgno pnum,lhpage *pMaster,lhpage **ppOut,int iNest)
{
	unqlite_page *pRaw;
	lhpage *pPage = 0; /* cc warning */
	int rc;
	/* Aquire the page from the pager first */
	rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,pnum,&pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	if( pRaw->pUserData ){
		/* The page is already parsed and loaded in memory. Point to it */
		pPage = (lhpage *)pRaw->pUserData;
	}else{
		/* Allocate a new page */
		pPage = lhNewPage(pEngine,pRaw,pMaster);
		if( pPage == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Process the page */
		rc = lhParsePageHeader(pPage);
		if( rc == UNQLITE_OK ){
			/* Load cells */
			rc = lhLoadCells(pPage);
		}
		if( rc != UNQLITE_OK ){
			pEngine->pIo->xPageUnref(pPage->pRaw); /* pPage will be released inside this call */
			return rc;
		}
		if( pPage->sHdr.iSlave > 0 && iNest < 128 ){
			if( pMaster == 0 ){
				pMaster = pPage;
			}
			/* Slave page. Not a fatal error if something goes wrong here */
			lhLoadPage(pEngine,pPage->sHdr.iSlave,pMaster,0,iNest++);
		}
	}
	if( ppOut ){
		*ppOut = pPage;
	}
	return UNQLITE_OK;
}